

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_table.cpp
# Opt level: O3

void __thiscall
InlineTable_MustBeOneLine4_Test::~InlineTable_MustBeOneLine4_Test
          (InlineTable_MustBeOneLine4_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(InlineTable, MustBeOneLine4) {
    std::istringstream input("key = {\"key\" =123,\n\tkey=345 , 123 = \t'value' } ");
    events_aggregator_t handler;

    try {
        loltoml::parse(input, handler);
        FAIL();
    } catch (const loltoml::parser_error_t &e) {
        EXPECT_EQ(18, e.offset());
    }
}